

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int InitCCITTFax3(TIFF *tif)

{
  int *piVar1;
  int iVar2;
  uint8_t *puVar3;
  Fax3BaseState *sp;
  TIFF *tif_local;
  
  iVar2 = _TIFFMergeFields(tif,faxFields,5);
  if (iVar2 == 0) {
    TIFFErrorExtR(tif,"InitCCITTFax3","Merging common CCITT Fax codec-specific tags failed");
    tif_local._4_4_ = 0;
  }
  else {
    puVar3 = (uint8_t *)_TIFFmallocExt(tif,0xa0);
    tif->tif_data = puVar3;
    if (tif->tif_data == (uint8_t *)0x0) {
      TIFFErrorExtR(tif,"InitCCITTFax3","No space for state block");
      tif_local._4_4_ = 0;
    }
    else {
      _TIFFmemset(tif->tif_data,0,0xa0);
      piVar1 = (int *)tif->tif_data;
      *piVar1 = tif->tif_mode;
      *(TIFFVGetMethod *)(piVar1 + 10) = (tif->tif_tagmethods).vgetfield;
      (tif->tif_tagmethods).vgetfield = Fax3VGetField;
      *(TIFFVSetMethod *)(piVar1 + 0xc) = (tif->tif_tagmethods).vsetfield;
      (tif->tif_tagmethods).vsetfield = Fax3VSetField;
      *(TIFFPrintMethod *)(piVar1 + 0xe) = (tif->tif_tagmethods).printdir;
      (tif->tif_tagmethods).printdir = Fax3PrintDir;
      piVar1[8] = 0;
      if (*piVar1 == 0) {
        tif->tif_flags = tif->tif_flags | 0x100;
      }
      puVar3 = tif->tif_data;
      puVar3[0x60] = '\0';
      puVar3[0x61] = '\0';
      puVar3[0x62] = '\0';
      puVar3[99] = '\0';
      puVar3[100] = '\0';
      puVar3[0x65] = '\0';
      puVar3[0x66] = '\0';
      puVar3[0x67] = '\0';
      TIFFSetField(tif,0x10004,_TIFFFax3fillruns);
      puVar3 = tif->tif_data;
      puVar3[0x88] = '\0';
      puVar3[0x89] = '\0';
      puVar3[0x8a] = '\0';
      puVar3[0x8b] = '\0';
      puVar3[0x8c] = '\0';
      puVar3[0x8d] = '\0';
      puVar3[0x8e] = '\0';
      puVar3[0x8f] = '\0';
      tif->tif_fixuptags = Fax3FixupTags;
      tif->tif_setupdecode = Fax3SetupState;
      tif->tif_predecode = Fax3PreDecode;
      tif->tif_decoderow = Fax3Decode1D;
      tif->tif_decodestrip = Fax3Decode1D;
      tif->tif_decodetile = Fax3Decode1D;
      tif->tif_setupencode = Fax3SetupState;
      tif->tif_preencode = Fax3PreEncode;
      tif->tif_postencode = Fax3PostEncode;
      tif->tif_encoderow = Fax3Encode;
      tif->tif_encodestrip = Fax3Encode;
      tif->tif_encodetile = Fax3Encode;
      tif->tif_close = Fax3Close;
      tif->tif_cleanup = Fax3Cleanup;
      tif_local._4_4_ = 1;
    }
  }
  return tif_local._4_4_;
}

Assistant:

static int InitCCITTFax3(TIFF *tif)
{
    static const char module[] = "InitCCITTFax3";
    Fax3BaseState *sp;

    /*
     * Merge codec-specific tag information.
     */
    if (!_TIFFMergeFields(tif, faxFields, TIFFArrayCount(faxFields)))
    {
        TIFFErrorExtR(tif, "InitCCITTFax3",
                      "Merging common CCITT Fax codec-specific tags failed");
        return 0;
    }

    /*
     * Allocate state block so tag methods have storage to record values.
     */
    tif->tif_data = (uint8_t *)_TIFFmallocExt(tif, sizeof(Fax3CodecState));

    if (tif->tif_data == NULL)
    {
        TIFFErrorExtR(tif, module, "No space for state block");
        return (0);
    }
    _TIFFmemset(tif->tif_data, 0, sizeof(Fax3CodecState));

    sp = Fax3State(tif);
    sp->rw_mode = tif->tif_mode;

    /*
     * Override parent get/set field methods.
     */
    sp->vgetparent = tif->tif_tagmethods.vgetfield;
    tif->tif_tagmethods.vgetfield = Fax3VGetField; /* hook for codec tags */
    sp->vsetparent = tif->tif_tagmethods.vsetfield;
    tif->tif_tagmethods.vsetfield = Fax3VSetField; /* hook for codec tags */
    sp->printdir = tif->tif_tagmethods.printdir;
    tif->tif_tagmethods.printdir = Fax3PrintDir; /* hook for codec tags */
    sp->groupoptions = 0;

    if (sp->rw_mode == O_RDONLY) /* FIXME: improve for in place update */
        tif->tif_flags |= TIFF_NOBITREV; /* decoder does bit reversal */
    DecoderState(tif)->runs = NULL;
    TIFFSetField(tif, TIFFTAG_FAXFILLFUNC, _TIFFFax3fillruns);
    EncoderState(tif)->refline = NULL;

    /*
     * Install codec methods.
     */
    tif->tif_fixuptags = Fax3FixupTags;
    tif->tif_setupdecode = Fax3SetupState;
    tif->tif_predecode = Fax3PreDecode;
    tif->tif_decoderow = Fax3Decode1D;
    tif->tif_decodestrip = Fax3Decode1D;
    tif->tif_decodetile = Fax3Decode1D;
    tif->tif_setupencode = Fax3SetupState;
    tif->tif_preencode = Fax3PreEncode;
    tif->tif_postencode = Fax3PostEncode;
    tif->tif_encoderow = Fax3Encode;
    tif->tif_encodestrip = Fax3Encode;
    tif->tif_encodetile = Fax3Encode;
    tif->tif_close = Fax3Close;
    tif->tif_cleanup = Fax3Cleanup;

    return (1);
}